

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsValue.c
# Opt level: O0

void JsToNumber(JsValue *val,JsValue *res)

{
  undefined4 uVar1;
  double dVar2;
  double local_58;
  undefined1 local_48 [8];
  JsValue primitive;
  double d1;
  char *pEnd;
  char *szOrbits;
  JsValue *res_local;
  JsValue *val_local;
  
  res->type = JS_NUMBER;
  szOrbits = (char *)res;
  res_local = val;
  switch(val->type) {
  case JS_UNDEFINED:
    (res->u).number = NAN;
    break;
  case JS_NULL:
    (res->u).number = 0.0;
    break;
  case JS_BOOLEAN:
    local_58 = 1.0;
    if ((val->u).boolean == 0) {
      local_58 = 0.0;
    }
    (res->u).number = local_58;
    break;
  case JS_NUMBER:
    uVar1 = *(undefined4 *)&val->field_0x4;
    res->type = val->type;
    *(undefined4 *)&res->field_0x4 = uVar1;
    (res->u).number = (val->u).number;
    (res->u).reference.name = (val->u).reference.name;
    break;
  case JS_STRING:
    pEnd = (val->u).string;
    dVar2 = strtod(pEnd,(char **)&d1);
    if (*(char *)d1 == '\0') {
      *(double *)(szOrbits + 8) = dVar2;
    }
    else {
      szOrbits[8] = '\0';
      szOrbits[9] = '\0';
      szOrbits[10] = '\0';
      szOrbits[0xb] = '\0';
      szOrbits[0xc] = '\0';
      szOrbits[0xd] = '\0';
      szOrbits[0xe] = -8;
      szOrbits[0xf] = '\x7f';
    }
    break;
  case JS_OBJECT:
    JsToPrimitive(val,1,(JsValue *)local_48);
    JsToNumber((JsValue *)local_48,(JsValue *)szOrbits);
    break;
  default:
    JsThrowString("JsToNumbeError");
  }
  return;
}

Assistant:

void JsToNumber(struct JsValue *val, struct JsValue *res){
	
	res->type = JS_NUMBER;
	switch (val->type) {
	case JS_UNDEFINED:
		res->u.number =  JS_VALUE_NUMBER_NAN;
		break;
	case JS_NULL:
		res->u.number = 0.0;
		break;
	case JS_BOOLEAN:
		res->u.number =  (val->u.boolean ? 1.0 : 0.0);
		break;
	case JS_NUMBER:
		*res = *val;
		break;
	case JS_STRING:{
			char * szOrbits, *pEnd;
			double d1;
			szOrbits = val->u.string;
			d1 = strtod (szOrbits,&pEnd);

			if(*pEnd == '\0'){
				res->u.number = d1;
			}else{
				//如果不是字符串末尾, 则表示没有解析完该字符串
				res->u.number = JS_VALUE_NUMBER_NAN;
			}
			break;
	    }
	case JS_OBJECT:{
			struct JsValue  primitive;
			JsToPrimitive(val,JS_OBJECT_HIT_TYPE_NUMBER,&primitive);
			JsToNumber(&primitive, res);
			break;
	    }
	default:
		JsThrowString("JsToNumbeError");
	}

}